

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O2

int png_safe_execute(png_imagep image,_func_int_png_voidp *function,png_voidp arg)

{
  png_voidp pvVar1;
  int iVar2;
  png_controlp ppVar3;
  jmp_buf safe_jmpbuf;
  
  pvVar1 = image->opaque->error_buf;
  iVar2 = _setjmp((__jmp_buf_tag *)safe_jmpbuf);
  ppVar3 = image->opaque;
  if (iVar2 == 0) {
    ppVar3->error_buf = safe_jmpbuf;
    iVar2 = (*function)(arg);
    ppVar3 = image->opaque;
    ppVar3->error_buf = pvVar1;
    if (iVar2 != 0) {
      return 1;
    }
  }
  ppVar3->error_buf = pvVar1;
  if (pvVar1 == (png_voidp)0x0) {
    png_image_free(image);
  }
  return 0;
}

Assistant:

int /* PRIVATE */
png_safe_execute(png_imagep image, int (*function)(png_voidp), png_voidp arg)
{
   const png_voidp saved_error_buf = image->opaque->error_buf;
   jmp_buf safe_jmpbuf;

   /* Safely execute function(arg), with png_error returning back here. */
   if (setjmp(safe_jmpbuf) == 0)
   {
      int result;

      image->opaque->error_buf = safe_jmpbuf;
      result = function(arg);
      image->opaque->error_buf = saved_error_buf;

      if (result)
         return 1; /* success */
   }

   /* The function failed either because of a caught png_error and a regular
    * return of false above or because of an uncaught png_error from the
    * function itself.  Ensure that the error_buf is always set back to the
    * value saved above:
    */
   image->opaque->error_buf = saved_error_buf;

   /* On the final false return, when about to return control to the caller, the
    * image is freed (png_image_free does this check but it is duplicated here
    * for clarity:
    */
   if (saved_error_buf == NULL)
      png_image_free(image);

   return 0; /* failure */
}